

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPUDetailsWidget.cpp
# Opt level: O1

bool __thiscall GPUDetailsWidget::event(GPUDetailsWidget *this,QEvent *event)

{
  undefined1 uVar1;
  long lVar2;
  bool bVar3;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QArrayData *local_58;
  long local_48;
  QRect local_40;
  QPoint local_30;
  
  if (*(short *)(event + 8) != 0x6e) {
    uVar1 = QWidget::event((QEvent *)this);
    return (bool)uVar1;
  }
  lVar2 = QWidget::childAt((QPoint *)this);
  if (lVar2 == 0) {
    bVar3 = false;
  }
  else {
    QWidget::toolTip();
    bVar3 = local_48 != 0;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
  }
  if (bVar3) {
    QWidget::toolTip();
    local_40.x1 = 0;
    local_40.y1 = 0;
    local_40.x2 = -1;
    local_40.y2 = -1;
    QToolTip::showText((QPoint *)(event + 0x18),(QString *)&local_78,(QWidget *)0x0,&local_40,-1);
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,2,8);
      }
    }
    if (bVar3) {
      return true;
    }
  }
  local_30.xp = 0;
  local_30.yp = 0;
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_40.x1 = 0;
  local_40.y1 = 0;
  local_40.x2 = -1;
  local_40.y2 = -1;
  QToolTip::showText(&local_30,(QString *)&local_78,(QWidget *)0x0,&local_40,-1);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  event[0xc] = (QEvent)0x0;
  return true;
}

Assistant:

bool GPUDetailsWidget::event(QEvent *event) {
    if (event->type() == QEvent::ToolTip) {
        auto helpEvent = static_cast<QHelpEvent*>(event);

        if (auto child = childAt(helpEvent->pos()); child && !child->toolTip().isEmpty()) {
            QToolTip::showText(helpEvent->globalPos(), child->toolTip());
            return true;
        }

        QToolTip::hideText();
        event->ignore();

        return true;
    }

    return QWidget::event(event);
}